

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O2

int __thiscall re2::Compiler::AllocInst(Compiler *this,int n)

{
  Inst *__src;
  Inst *__s;
  int iVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  
  if (this->failed_ == false) {
    iVar4 = this->inst_len_;
    iVar1 = iVar4 + n;
    if (iVar1 <= this->max_inst_) {
      iVar3 = this->inst_cap_;
      if (iVar3 < iVar1) {
        if (iVar3 != 0) goto LAB_0012734e;
        iVar3 = 8;
        while( true ) {
          this->inst_cap_ = iVar3;
LAB_0012734e:
          if (iVar1 <= iVar3) break;
          iVar3 = iVar3 * 2;
        }
        uVar2 = 0xffffffffffffffff;
        if (-1 < iVar3) {
          uVar2 = (long)iVar3 << 3;
        }
        __s = (Inst *)operator_new__(uVar2);
        if (iVar3 != 0) {
          memset(__s,0,(long)iVar3 << 3);
        }
        __src = this->inst_;
        memmove(__s,__src,(long)iVar4 * 8);
        memset(__s + iVar4,0,(long)(iVar3 - iVar4) << 3);
        if (__src != (Inst *)0x0) {
          operator_delete__(__src);
          iVar4 = this->inst_len_;
          iVar1 = n + iVar4;
        }
        this->inst_ = __s;
      }
      this->inst_len_ = iVar1;
      return iVar4;
    }
  }
  this->failed_ = true;
  return -1;
}

Assistant:

int Compiler::AllocInst(int n) {
  if (failed_ || inst_len_ + n > max_inst_) {
    failed_ = true;
    return -1;
  }

  if (inst_len_ + n > inst_cap_) {
    if (inst_cap_ == 0)
      inst_cap_ = 8;
    while (inst_len_ + n > inst_cap_)
      inst_cap_ *= 2;
    Prog::Inst* ip = new Prog::Inst[inst_cap_];
    memmove(ip, inst_, inst_len_ * sizeof ip[0]);
    memset(ip + inst_len_, 0, (inst_cap_ - inst_len_) * sizeof ip[0]);
    delete[] inst_;
    inst_ = ip;
  }
  int id = inst_len_;
  inst_len_ += n;
  return id;
}